

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

void __thiscall QAction::setStatusTip(QAction *this,QString *statustip)

{
  QString *s1;
  QActionPrivate *this_00;
  bool bVar1;
  
  this_00 = *(QActionPrivate **)&this->field_0x8;
  s1 = &this_00->statustip;
  bVar1 = ::comparesEqual(s1,statustip);
  if (bVar1) {
    return;
  }
  QString::operator=(s1,(QString *)statustip);
  QActionPrivate::sendDataChanged(this_00);
  return;
}

Assistant:

void QAction::setStatusTip(const QString &statustip)
{
    Q_D(QAction);
    if (d->statustip == statustip)
        return;

    d->statustip = statustip;
    d->sendDataChanged();
}